

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall xray_re::cse_alife_creature_actor::update_write(cse_alife_creature_actor *this)

{
  xr_packet *in_RSI;
  
  update_write((cse_alife_creature_actor *)&this[-1].super_cse_alife_creature_abstract.field_0x58,
               in_RSI);
  return;
}

Assistant:

void cse_alife_creature_actor::update_write(xr_packet& packet)
{
	cse_alife_creature_abstract::update_write(packet);
	packet.w_u16(m_state);
	packet.w_sdir(m_accel);
	packet.w_sdir(m_velocity);
	packet.w_float(m_radiation);
	packet.w_u8(m_weapon);
	packet.w_u16(m_num_items);
	xr_assert(m_num_items == 0);
}